

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O2

void Gia_ManConvertPackingToEdges(Gia_Man_t *p)

{
  Vec_Int_t **p_00;
  int iVar1;
  int iVar2;
  int i;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Vec_Int_t *pVVar9;
  ulong uVar10;
  Vec_Int_t **p_01;
  int iVar11;
  int local_6c;
  int nNodes [4];
  
  if (p->vPacking != (Vec_Int_t *)0x0) {
    p_01 = &p->vEdge1;
    Vec_IntFreeP(p_01);
    p_00 = &p->vEdge2;
    Vec_IntFreeP(p_00);
    pVVar9 = Vec_IntStart(p->nObjs);
    p->vEdge1 = pVVar9;
    pVVar9 = Vec_IntStart(p->nObjs);
    p->vEdge2 = pVVar9;
    iVar11 = 0;
    iVar2 = Vec_IntEntry(p->vPacking,0);
    local_6c = 0;
    iVar4 = 1;
LAB_00580eff:
    i = iVar4;
    if (i < p->vPacking->nSize) {
      uVar3 = Vec_IntEntry(p->vPacking,i);
      if (2 < uVar3 - 1) {
        __assert_fail("Entry > 0 && Entry < 4",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaEdge.c"
                      ,0x84,"void Gia_ManConvertPackingToEdges(Gia_Man_t *)");
      }
      for (uVar10 = 0; iVar4 = nNodes[2], iVar6 = nNodes[1], iVar5 = nNodes[0], iVar1 = (int)uVar10,
          uVar3 != uVar10; uVar10 = uVar10 + 1) {
        iVar4 = Vec_IntEntry(p->vPacking,i + 1 + iVar1);
        nNodes[uVar10] = iVar4;
      }
      iVar11 = iVar11 + 1;
      if ((ulong)uVar3 != 3) goto code_r0x00580f56;
      iVar6 = Gia_ObjEdgeAdd(nNodes[0],nNodes[2],*p_01,*p_00);
      iVar7 = Gia_ObjEdgeAdd(iVar4,iVar5,*p_01,*p_00);
      iVar5 = nNodes[1];
      iVar8 = Gia_ObjEdgeAdd(nNodes[1],iVar4,*p_01,*p_00);
      iVar4 = Gia_ObjEdgeAdd(iVar4,iVar5,*p_01,*p_00);
      local_6c = iVar4 + iVar8 + iVar7 + iVar6 + local_6c;
      goto LAB_00581041;
    }
    if (iVar2 != iVar11) {
      __assert_fail("nEntries == nEntries2",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaEdge.c"
                    ,0x98,"void Gia_ManConvertPackingToEdges(Gia_Man_t *)");
    }
    if (local_6c != 0) {
      printf("Skipped %d illegal edges.\n");
      return;
    }
  }
  return;
code_r0x00580f56:
  iVar4 = i + iVar1 + 1;
  if (uVar3 == 2) {
    iVar4 = Gia_ObjEdgeAdd(nNodes[0],nNodes[1],*p_01,*p_00);
    iVar5 = Gia_ObjEdgeAdd(iVar6,iVar5,*p_01,*p_00);
    local_6c = iVar5 + iVar4 + local_6c;
LAB_00581041:
    iVar4 = i + iVar1 + 1;
  }
  goto LAB_00580eff;
}

Assistant:

void Gia_ManConvertPackingToEdges( Gia_Man_t * p )
{
    int i, k, Entry, nEntries, nEntries2, nNodes[4], Count = 0;
    if ( p->vPacking == NULL )
        return;
    Vec_IntFreeP( &p->vEdge1 );
    Vec_IntFreeP( &p->vEdge2 );
    p->vEdge1 = Vec_IntStart( Gia_ManObjNum(p) );
    p->vEdge2 = Vec_IntStart( Gia_ManObjNum(p) );
    // iterate through structures
    nEntries = Vec_IntEntry( p->vPacking, 0 );
    nEntries2 = 0;
    Vec_IntForEachEntryStart( p->vPacking, Entry, i, 1 )
    {
        assert( Entry > 0 && Entry < 4 );
        i++;
        for ( k = 0; k < Entry; k++, i++ )
            nNodes[k] = Vec_IntEntry(p->vPacking, i);
        i--;
        nEntries2++;
        // create edges
        if ( Entry == 2 )
        {
            Count += Gia_ObjEdgeAdd( nNodes[0], nNodes[1], p->vEdge1, p->vEdge2 );
            Count += Gia_ObjEdgeAdd( nNodes[1], nNodes[0], p->vEdge1, p->vEdge2 );
        }
        else if ( Entry == 3 )
        {
            Count += Gia_ObjEdgeAdd( nNodes[0], nNodes[2], p->vEdge1, p->vEdge2 );
            Count += Gia_ObjEdgeAdd( nNodes[2], nNodes[0], p->vEdge1, p->vEdge2 );
            Count += Gia_ObjEdgeAdd( nNodes[1], nNodes[2], p->vEdge1, p->vEdge2 );
            Count += Gia_ObjEdgeAdd( nNodes[2], nNodes[1], p->vEdge1, p->vEdge2 );
        }
    }
    assert( nEntries == nEntries2 );
    if ( Count )
        printf( "Skipped %d illegal edges.\n", Count );
}